

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::sendMessage
          (CommonCore *this,InterfaceHandle sourceHandle,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view str;
  __normal_iterator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  __last;
  bool bVar1;
  GlobalBrokerId id;
  GlobalFederateId GVar2;
  int iVar3;
  BasicHandleInfo *this_00;
  undefined8 uVar4;
  FederateState *this_01;
  string *psVar5;
  __normal_iterator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  _Var6;
  char *__str;
  BaseType in_ESI;
  long in_RDI;
  __sv_type message_06;
  __normal_iterator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  res;
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  targets_1;
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  targets;
  Time minTime;
  FederateState *fed;
  ActionMessage mess;
  unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *hndl;
  ActionMessage mess_1;
  undefined4 in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb8c;
  undefined4 in_stack_fffffffffffffb90;
  InterfaceHandle in_stack_fffffffffffffb94;
  ActionMessage *in_stack_fffffffffffffb98;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba8;
  int in_stack_fffffffffffffbac;
  undefined1 *puVar7;
  ActionMessage *in_stack_fffffffffffffbb0;
  char *pcVar8;
  undefined8 in_stack_fffffffffffffbb8;
  undefined7 in_stack_fffffffffffffbc0;
  undefined1 in_stack_fffffffffffffbc7;
  CommonCore *in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  LocalFederateId in_stack_fffffffffffffbd4;
  InterfaceHandle handle;
  undefined4 in_stack_fffffffffffffc00;
  char local_398 [32];
  pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_> *local_378;
  pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_> *local_370;
  pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_> *local_368;
  BaseType local_35c;
  undefined1 local_358 [16];
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *in_stack_fffffffffffffcb8;
  ActionMessage *in_stack_fffffffffffffcc0;
  undefined1 local_310 [32];
  char *local_2f0;
  undefined8 local_2e8;
  undefined1 local_2e0 [19];
  undefined1 in_stack_fffffffffffffd33;
  int in_stack_fffffffffffffd34;
  FederateState *in_stack_fffffffffffffd38;
  string_view in_stack_fffffffffffffd50;
  TimeRepresentation<count_time<9,_long>_> local_2a0;
  BaseType local_294;
  CommonCore *in_stack_fffffffffffffd70;
  GlobalHandle in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  __int_type_conflict1 in_stack_fffffffffffffd9c;
  GlobalFederateId GVar9;
  InterfaceHandle IVar10;
  TimeRepresentation<count_time<9,_long>_> local_248 [7];
  format_args in_stack_fffffffffffffdf0;
  string_view in_stack_fffffffffffffe00;
  ActionMessage *in_stack_fffffffffffffe50;
  GlobalFederateId local_168 [8];
  BaseType local_148;
  BaseType local_144;
  undefined4 local_84;
  InterfaceHandle local_6c;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined1 *local_50;
  char *local_48;
  undefined8 uStack_40;
  undefined1 *local_30;
  char *local_28;
  undefined8 uStack_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_84 = 0xffe55eae;
  local_6c.hid = in_ESI;
  bVar1 = InterfaceHandle::operator==(&local_6c,(InterfaceHandle)0xffe55eae);
  if (bVar1) {
    bVar1 = waitCoreRegistration(in_stack_fffffffffffffd70);
    if (!bVar1) {
      uVar4 = __cxa_allocate_exception(0x28);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
      message_00._M_len._4_4_ = in_stack_fffffffffffffbac;
      message_00._M_len._0_4_ = in_stack_fffffffffffffba8;
      message_00._M_str = (char *)in_stack_fffffffffffffbb0;
      FunctionExecutionFailure::FunctionExecutionFailure
                ((FunctionExecutionFailure *)in_stack_fffffffffffffba0,message_00);
      __cxa_throw(uVar4,&FunctionExecutionFailure::typeinfo,
                  FunctionExecutionFailure::~FunctionExecutionFailure);
    }
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
               CONCAT44(in_stack_fffffffffffffb94.hid,in_stack_fffffffffffffb90),
               (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
               CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    ActionMessage::ActionMessage(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
               in_stack_fffffffffffffba0);
    id = CLI::std::atomic<helics::GlobalBrokerId>::load
                   ((atomic<helics::GlobalBrokerId> *)(in_RDI + 0x10),seq_cst);
    GlobalFederateId::GlobalFederateId(local_168,id);
    local_148 = local_168[0].gid;
    local_144 = local_6c.hid;
    BrokerBase::addActionMessage
              ((BrokerBase *)CONCAT44(in_stack_fffffffffffffb94.hid,in_stack_fffffffffffffb90),
               (ActionMessage *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    ActionMessage::~ActionMessage
              ((ActionMessage *)CONCAT44(in_stack_fffffffffffffb94.hid,in_stack_fffffffffffffb90));
  }
  else {
    this_00 = (BasicHandleInfo *)
              getHandleInfo((CommonCore *)
                            CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                            in_stack_fffffffffffffb94);
    if (this_00 == (BasicHandleInfo *)0x0) {
      uVar4 = __cxa_allocate_exception(0x28);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
      message_01._M_len._4_4_ = in_stack_fffffffffffffbac;
      message_01._M_len._0_4_ = in_stack_fffffffffffffba8;
      message_01._M_str = (char *)in_stack_fffffffffffffbb0;
      InvalidIdentifier::InvalidIdentifier
                ((InvalidIdentifier *)in_stack_fffffffffffffba0,message_01);
      __cxa_throw(uVar4,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
    }
    if (this_00->handleType != ENDPOINT) {
      uVar4 = __cxa_allocate_exception(0x28);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
      message_02._M_len._4_4_ = in_stack_fffffffffffffbac;
      message_02._M_len._0_4_ = in_stack_fffffffffffffba8;
      message_02._M_str = (char *)in_stack_fffffffffffffbb0;
      InvalidIdentifier::InvalidIdentifier
                ((InvalidIdentifier *)in_stack_fffffffffffffba0,message_02);
      __cxa_throw(uVar4,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
    }
    bVar1 = checkActionFlag<helics::BasicHandleInfo,helics::EndpointFlags>
                      ((unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                        *)this_00,receive_only_flag);
    if (bVar1) {
      uVar4 = __cxa_allocate_exception(0x28);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
      message_03._M_len._4_4_ = in_stack_fffffffffffffbac;
      message_03._M_len._0_4_ = in_stack_fffffffffffffba8;
      message_03._M_str = (char *)in_stack_fffffffffffffbb0;
      InvalidFunctionCall::InvalidFunctionCall
                ((InvalidFunctionCall *)in_stack_fffffffffffffba0,message_03);
      __cxa_throw(uVar4,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
    }
    _Var6._M_current =
         (pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_> *)
         &stack0xfffffffffffffd90;
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
               CONCAT44(in_stack_fffffffffffffb94.hid,in_stack_fffffffffffffb90),
               (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
               CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    ActionMessage::ActionMessage(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
               in_stack_fffffffffffffba0);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb94.hid,in_stack_fffffffffffffb90));
    str._M_str._0_7_ = in_stack_fffffffffffffbc0;
    str._M_len = in_stack_fffffffffffffbb8;
    str._M_str._7_1_ = in_stack_fffffffffffffbc7;
    ActionMessage::setString(in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,str);
    GVar2 = BasicHandleInfo::getFederateId(this_00);
    GVar9 = GVar2;
    IVar10.hid = local_6c.hid;
    if (in_stack_fffffffffffffd9c == 0) {
      in_stack_fffffffffffffd9c =
           std::__atomic_base<int>::operator++((__atomic_base<int> *)(in_RDI + 0x540));
    }
    local_294 = (this_00->local_fed_id).fid;
    this_01 = getFederateAt(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbd4);
    local_2a0.internalTimeCode = (baseType)FederateState::nextAllowedSendTime(this_01);
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(local_248,&local_2a0);
    if (bVar1) {
      local_248[0].internalTimeCode = local_2a0.internalTimeCode;
    }
    iVar3 = FederateState::loggingLevel((FederateState *)0x556f53);
    if (0x11 < iVar3) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
      local_2f0 = "send_message {}";
      local_2e8 = 0xf;
      prettyPrintString_abi_cxx11_(in_stack_fffffffffffffe50);
      local_18 = local_2e0;
      local_28 = local_2f0;
      uStack_20 = local_2e8;
      local_30 = local_310;
      local_48 = local_2f0;
      uStack_40 = local_2e8;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                ((value<fmt::v11::context> *)in_stack_fffffffffffffba0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb98);
      local_8 = &local_58;
      local_10 = local_68;
      local_58 = 0xd;
      local_50 = local_10;
      ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf0);
      message_06 = std::__cxx11::string::operator_cast_to_basic_string_view
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffb94.hid,in_stack_fffffffffffffb90));
      in_stack_fffffffffffffb88 = 0;
      FederateState::logMessage
                (in_stack_fffffffffffffd38,in_stack_fffffffffffffd34,in_stack_fffffffffffffd50,
                 message_06,(bool)in_stack_fffffffffffffd33);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb94.hid,in_stack_fffffffffffffb90));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb94.hid,in_stack_fffffffffffffb90));
    }
    psVar5 = ActionMessage::getString_abi_cxx11_
                       (in_stack_fffffffffffffb98,in_stack_fffffffffffffb94.hid);
    handle.hid = (BaseType)((ulong)psVar5 >> 0x20);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x557168
                      );
    if (bVar1) {
      bVar1 = checkActionFlag<helics::BasicHandleInfo,helics::EndpointFlags>
                        ((unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                          *)this_00,targeted_flag);
      if (!bVar1) {
        uVar4 = __cxa_allocate_exception(0x28);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
        message_04._M_len._4_4_ = in_stack_fffffffffffffbac;
        message_04._M_len._0_4_ = in_stack_fffffffffffffba8;
        message_04._M_str = (char *)in_stack_fffffffffffffbb0;
        InvalidParameter::InvalidParameter((InvalidParameter *)in_stack_fffffffffffffba0,message_04)
        ;
        __cxa_throw(uVar4,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
      }
      FederateState::getMessageDestinations
                ((FederateState *)
                 CONCAT44(CONCAT13(bVar1,(int3)in_stack_fffffffffffffbd4.fid),
                          in_stack_fffffffffffffbd0),handle);
      bVar1 = std::
              vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              ::empty((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                       *)in_stack_fffffffffffffba0);
      if (!bVar1) {
        generateMessages((CommonCore *)CONCAT44(IVar10.hid,GVar9.gid),
                         (ActionMessage *)
                         CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                         (vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                          *)in_stack_fffffffffffffd90);
      }
      std::
      vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::~vector((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 *)in_stack_fffffffffffffba0);
    }
    else {
      bVar1 = checkActionFlag<helics::BasicHandleInfo,helics::EndpointFlags>
                        ((unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                          *)this_00,targeted_flag);
      if (bVar1) {
        local_35c = local_6c.hid;
        FederateState::getMessageDestinations
                  ((FederateState *)
                   CONCAT44(in_stack_fffffffffffffbd4.fid,in_stack_fffffffffffffbd0),handle);
        puVar7 = local_358;
        local_370 = (pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>
                     *)std::
                       vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                       ::begin((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        local_378 = (pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>
                     *)std::
                       vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                       ::end((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        pcVar8 = local_398;
        ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffffb98,in_stack_fffffffffffffb94.hid)
        ;
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbd4.fid,in_stack_fffffffffffffbd0),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffbc8);
        __last._M_current._4_4_ = GVar2.gid;
        __last._M_current._0_4_ = in_stack_fffffffffffffc00;
        _Var6 = std::
                find_if<__gnu_cxx::__normal_iterator<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>*,std::vector<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>>>>,helics::CommonCore::sendMessage(helics::InterfaceHandle,std::unique_ptr<helics::Message,std::default_delete<helics::Message>>)::__0>
                          (_Var6,__last,(anon_class_32_1_bc572e6e_for__M_pred *)this_01);
        local_368 = _Var6._M_current;
        sendMessage(helics::InterfaceHandle,std::unique_ptr<helics::Message,std::default_delete<helics::Message>>)
        ::$_0::~__0((anon_class_32_1_bc572e6e_for__M_pred *)0x5573a3);
        std::
        vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
        ::end((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        bVar1 = __gnu_cxx::
                operator==<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                          ((__normal_iterator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffffb94.hid,in_stack_fffffffffffffb90),
                           (__normal_iterator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        if (bVar1) {
          __str = (char *)__cxa_allocate_exception(0x28);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)_Var6._M_current,__str);
          message_05._M_str = pcVar8;
          message_05._M_len = (size_t)puVar7;
          InvalidParameter::InvalidParameter((InvalidParameter *)_Var6._M_current,message_05);
          __cxa_throw(__str,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
        }
        std::
        vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
        ::~vector((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   *)_Var6._M_current);
      }
      BrokerBase::addActionMessage
                ((BrokerBase *)CONCAT44(in_stack_fffffffffffffb94.hid,in_stack_fffffffffffffb90),
                 (ActionMessage *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    }
    ActionMessage::~ActionMessage
              ((ActionMessage *)CONCAT44(in_stack_fffffffffffffb94.hid,in_stack_fffffffffffffb90));
  }
  return;
}

Assistant:

void CommonCore::sendMessage(InterfaceHandle sourceHandle, std::unique_ptr<Message> message)
{
    if (sourceHandle == gDirectSendHandle) {
        if (!waitCoreRegistration()) {
            throw(FunctionExecutionFailure(
                "core is unable to register and has timed out, message was not sent"));
        }
        ActionMessage mess(std::move(message));
        mess.source_id = global_id.load();
        mess.source_handle = sourceHandle;
        addActionMessage(std::move(mess));
        return;
    }
    const auto* hndl = getHandleInfo(sourceHandle);
    if (hndl == nullptr) {
        throw(InvalidIdentifier("handle is not valid"));
    }
    if (hndl->handleType != InterfaceType::ENDPOINT) {
        throw(InvalidIdentifier("handle does not point to an endpoint"));
    }
    if (checkActionFlag(*hndl, receive_only_flag)) {
        throw(InvalidFunctionCall(
            "Endpoint is receive only; no messages can be sent through this endpoint"));
    }
    ActionMessage mess(std::move(message));

    mess.setString(sourceStringLoc, hndl->key);
    mess.source_id = hndl->getFederateId();
    mess.source_handle = sourceHandle;
    if (mess.messageID == 0) {
        mess.messageID = ++messageCounter;
    }
    auto* fed = getFederateAt(hndl->local_fed_id);
    auto minTime = fed->nextAllowedSendTime();
    if (mess.actionTime < minTime) {
        mess.actionTime = minTime;
    }

    if (fed->loggingLevel() >= HELICS_LOG_LEVEL_DATA) {
        fed->logMessage(HELICS_LOG_LEVEL_DATA,
                        "",
                        fmt::format("send_message {}", prettyPrintString(mess)));
    }
    if (mess.getString(targetStringLoc).empty()) {
        if (checkActionFlag(*hndl, targeted_flag)) {
            auto targets = fed->getMessageDestinations(sourceHandle);
            if (targets.empty()) {
                return;
            }
            generateMessages(mess, targets);
        } else {
            throw(InvalidParameter("no destination specified in message"));
        }
    } else {
        if (checkActionFlag(*hndl, targeted_flag)) {
            auto targets = fed->getMessageDestinations(sourceHandle);
            auto res = std::find_if(targets.begin(),
                                    targets.end(),
                                    [destination = mess.getString(targetStringLoc)](
                                        const auto& val) { return (val.second == destination); });
            if (res == targets.end()) {
                throw(InvalidParameter("targeted endpoint destination not in target list"));
            }
        }
        addActionMessage(std::move(mess));
    }
}